

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

bool __thiscall
google::protobuf::internal::ExtensionSet::ParseFieldWithExtensionInfo
          (ExtensionSet *this,int number,bool was_packed_on_wire,ExtensionInfo *extension,
          CodedInputStream *input,FieldSkipper *field_skipper)

{
  byte bVar1;
  byte *pbVar2;
  uint8 *puVar3;
  LogLevel_conflict *pLVar4;
  double *pdVar5;
  float *pfVar6;
  undefined8 uVar7;
  bool bVar8;
  Limit limit;
  uint32 uVar9;
  int iVar10;
  MessageLite *pMVar11;
  string *value_00;
  Extension *pEVar12;
  pair<int,_int> pVar13;
  int64 iVar14;
  LogMessage *other;
  uint64 value_01;
  unsigned_long uVar15;
  ulong uVar16;
  FieldDescriptor *pFVar17;
  FieldType FVar18;
  undefined7 in_register_00000011;
  uint uVar19;
  LogLevel_conflict LVar20;
  double dVar21;
  float value_02;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar22;
  pair<unsigned_long,_bool> pVar23;
  uint64 value;
  LogFinisher local_71;
  FieldSkipper *local_70;
  LogMessage local_68;
  
  if ((int)CONCAT71(in_register_00000011,was_packed_on_wire) != 0) {
    pbVar2 = input->buffer_;
    if (pbVar2 < input->buffer_end_) {
      uVar19 = (uint)*pbVar2;
      if (-1 < (char)*pbVar2) {
        input->buffer_ = pbVar2 + 1;
        goto LAB_002b8abc;
      }
    }
    else {
      uVar19 = 0;
    }
    iVar14 = io::CodedInputStream::ReadVarint32Fallback(input,uVar19);
    uVar19 = (uint)iVar14;
    if (iVar14 < 0) {
      return false;
    }
LAB_002b8abc:
    local_70 = field_skipper;
    limit = io::CodedInputStream::PushLimit(input,uVar19);
    switch(extension->type) {
    case '\x01':
      iVar10 = io::CodedInputStream::BytesUntilLimit(input);
      if (0 < iVar10) {
        do {
          pdVar5 = (double *)input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)pdVar5 < 8) {
            bVar8 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64 *)&local_68);
            dVar21 = (double)local_68._0_8_;
            if (!bVar8) {
              return false;
            }
          }
          else {
            dVar21 = *pdVar5;
            input->buffer_ = (uint8 *)(pdVar5 + 1);
          }
          AddDouble(this,number,'\x01',extension->is_packed,dVar21,extension->descriptor);
          iVar10 = io::CodedInputStream::BytesUntilLimit(input);
        } while (0 < iVar10);
      }
      break;
    case '\x02':
      iVar10 = io::CodedInputStream::BytesUntilLimit(input);
      if (0 < iVar10) {
        do {
          pfVar6 = (float *)input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)pfVar6 < 4) {
            bVar8 = io::CodedInputStream::ReadLittleEndian32Fallback(input,&local_68.level_);
            if (!bVar8) {
              return false;
            }
            value_02 = (float)local_68.level_;
          }
          else {
            value_02 = *pfVar6;
            input->buffer_ = (uint8 *)(pfVar6 + 1);
          }
          AddFloat(this,number,'\x02',extension->is_packed,value_02,extension->descriptor);
          iVar10 = io::CodedInputStream::BytesUntilLimit(input);
        } while (0 < iVar10);
      }
      break;
    case '\x03':
      while (iVar10 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar10) {
        puVar3 = input->buffer_;
        if ((puVar3 < input->buffer_end_) &&
           (uVar15 = (unsigned_long)(char)*puVar3, -1 < (long)uVar15)) {
          input->buffer_ = puVar3 + 1;
        }
        else {
          pVar23 = io::CodedInputStream::ReadVarint64Fallback(input);
          uVar15 = pVar23.first;
          if (((undefined1  [16])pVar23 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            return false;
          }
        }
        AddInt64(this,number,'\x03',extension->is_packed,uVar15,extension->descriptor);
      }
      break;
    case '\x04':
      while (iVar10 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar10) {
        puVar3 = input->buffer_;
        if ((puVar3 < input->buffer_end_) && (value_01 = (uint64)(char)*puVar3, -1 < (long)value_01)
           ) {
          input->buffer_ = puVar3 + 1;
        }
        else {
          pVar23 = io::CodedInputStream::ReadVarint64Fallback(input);
          value_01 = pVar23.first;
          if (((undefined1  [16])pVar23 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            return false;
          }
        }
        AddUInt64(this,number,'\x04',extension->is_packed,value_01,extension->descriptor);
      }
      break;
    case '\x05':
      while (iVar10 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar10) {
        pbVar2 = input->buffer_;
        if (pbVar2 < input->buffer_end_) {
          bVar1 = *pbVar2;
          uVar16 = (ulong)bVar1;
          uVar9 = (uint32)bVar1;
          if ((char)bVar1 < '\0') goto LAB_002b8bbc;
          input->buffer_ = pbVar2 + 1;
        }
        else {
          uVar9 = 0;
LAB_002b8bbc:
          uVar16 = io::CodedInputStream::ReadVarint32Fallback(input,uVar9);
          if ((long)uVar16 < 0) {
            return false;
          }
        }
        AddInt32(this,number,'\x05',extension->is_packed,(int32)uVar16,extension->descriptor);
      }
      break;
    case '\x06':
      iVar10 = io::CodedInputStream::BytesUntilLimit(input);
      if (0 < iVar10) {
        do {
          pdVar5 = (double *)input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)pdVar5 < 8) {
            bVar8 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64 *)&local_68);
            if (!bVar8) {
              return false;
            }
          }
          else {
            local_68._0_8_ = *pdVar5;
            input->buffer_ = (uint8 *)(pdVar5 + 1);
          }
          AddUInt64(this,number,'\x06',extension->is_packed,local_68._0_8_,extension->descriptor);
          iVar10 = io::CodedInputStream::BytesUntilLimit(input);
        } while (0 < iVar10);
      }
      break;
    case '\a':
      iVar10 = io::CodedInputStream::BytesUntilLimit(input);
      if (0 < iVar10) {
        do {
          pLVar4 = (LogLevel_conflict *)input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)pLVar4 < 4) {
            bVar8 = io::CodedInputStream::ReadLittleEndian32Fallback(input,&local_68.level_);
            if (!bVar8) {
              return false;
            }
            LVar20 = local_68.level_;
          }
          else {
            LVar20 = *pLVar4;
            local_68.level_ = LVar20;
            input->buffer_ = (uint8 *)(pLVar4 + 1);
          }
          AddUInt32(this,number,'\a',extension->is_packed,LVar20,extension->descriptor);
          iVar10 = io::CodedInputStream::BytesUntilLimit(input);
        } while (0 < iVar10);
      }
      break;
    case '\b':
      while (iVar10 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar10) {
        puVar3 = input->buffer_;
        if ((puVar3 < input->buffer_end_) &&
           (uVar15 = (unsigned_long)(char)*puVar3, -1 < (long)uVar15)) {
          input->buffer_ = puVar3 + 1;
        }
        else {
          pVar23 = io::CodedInputStream::ReadVarint64Fallback(input);
          uVar15 = pVar23.first;
          if (((undefined1  [16])pVar23 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            return false;
          }
        }
        AddBool(this,number,'\b',extension->is_packed,uVar15 != 0,extension->descriptor);
      }
      break;
    case '\t':
    case '\n':
    case '\v':
    case '\f':
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_FATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x504);
      other = LogMessage::operator<<(&local_68,"Non-primitive types can\'t be packed.");
      LogFinisher::operator=(&local_71,other);
      LogMessage::~LogMessage(&local_68);
      break;
    case '\r':
      while (iVar10 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar10) {
        pbVar2 = input->buffer_;
        if (pbVar2 < input->buffer_end_) {
          bVar1 = *pbVar2;
          uVar16 = (ulong)bVar1;
          uVar9 = (uint32)bVar1;
          if ((char)bVar1 < '\0') goto LAB_002b8c18;
          input->buffer_ = pbVar2 + 1;
        }
        else {
          uVar9 = 0;
LAB_002b8c18:
          uVar16 = io::CodedInputStream::ReadVarint32Fallback(input,uVar9);
          if ((long)uVar16 < 0) {
            return false;
          }
        }
        AddUInt32(this,number,'\r',extension->is_packed,(uint32)uVar16,extension->descriptor);
      }
      break;
    case '\x0e':
      iVar10 = io::CodedInputStream::BytesUntilLimit(input);
      while (0 < iVar10) {
        pbVar2 = input->buffer_;
        if (pbVar2 < input->buffer_end_) {
          uVar19 = (uint)*pbVar2;
          if ((char)*pbVar2 < '\0') goto LAB_002b8fd6;
          input->buffer_ = pbVar2 + 1;
        }
        else {
          uVar19 = 0;
LAB_002b8fd6:
          iVar14 = io::CodedInputStream::ReadVarint32Fallback(input,uVar19);
          uVar19 = (uint)iVar14;
          if (iVar14 < 0) {
            return false;
          }
        }
        bVar8 = (*(extension->field_3).enum_validity_check.func)
                          ((extension->field_3).enum_validity_check.arg,uVar19);
        if (bVar8) {
          AddEnum(this,number,'\x0e',extension->is_packed,uVar19,extension->descriptor);
        }
        else {
          (*local_70->_vptr_FieldSkipper[4])(local_70,number,(ulong)uVar19);
        }
        iVar10 = io::CodedInputStream::BytesUntilLimit(input);
      }
      break;
    case '\x0f':
      iVar10 = io::CodedInputStream::BytesUntilLimit(input);
      if (0 < iVar10) {
        do {
          pLVar4 = (LogLevel_conflict *)input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)pLVar4 < 4) {
            bVar8 = io::CodedInputStream::ReadLittleEndian32Fallback(input,&local_68.level_);
            if (!bVar8) {
              return false;
            }
            LVar20 = local_68.level_;
          }
          else {
            LVar20 = *pLVar4;
            input->buffer_ = (uint8 *)(pLVar4 + 1);
          }
          AddInt32(this,number,'\x0f',extension->is_packed,LVar20,extension->descriptor);
          iVar10 = io::CodedInputStream::BytesUntilLimit(input);
        } while (0 < iVar10);
      }
      break;
    case '\x10':
      iVar10 = io::CodedInputStream::BytesUntilLimit(input);
      if (0 < iVar10) {
        do {
          pdVar5 = (double *)input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)pdVar5 < 8) {
            bVar8 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64 *)&local_68);
            dVar21 = (double)local_68._0_8_;
            if (!bVar8) {
              return false;
            }
          }
          else {
            dVar21 = *pdVar5;
            input->buffer_ = (uint8 *)(pdVar5 + 1);
          }
          AddInt64(this,number,'\x10',extension->is_packed,(int64)dVar21,extension->descriptor);
          iVar10 = io::CodedInputStream::BytesUntilLimit(input);
        } while (0 < iVar10);
      }
      break;
    case '\x11':
      while (iVar10 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar10) {
        pbVar2 = input->buffer_;
        if (pbVar2 < input->buffer_end_) {
          bVar1 = *pbVar2;
          uVar16 = (ulong)bVar1;
          uVar9 = (uint32)bVar1;
          if ((char)bVar1 < '\0') goto LAB_002b8b58;
          input->buffer_ = pbVar2 + 1;
        }
        else {
          uVar9 = 0;
LAB_002b8b58:
          uVar16 = io::CodedInputStream::ReadVarint32Fallback(input,uVar9);
          if ((long)uVar16 < 0) {
            return false;
          }
        }
        AddInt32(this,number,'\x11',extension->is_packed,
                 -((uint)uVar16 & 1) ^ (uint)(uVar16 >> 1) & 0x7fffffff,extension->descriptor);
      }
      break;
    case '\x12':
      while (iVar10 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar10) {
        puVar3 = input->buffer_;
        if ((puVar3 < input->buffer_end_) && (uVar16 = (ulong)(char)*puVar3, -1 < (long)uVar16)) {
          input->buffer_ = puVar3 + 1;
        }
        else {
          pVar23 = io::CodedInputStream::ReadVarint64Fallback(input);
          uVar16 = pVar23.first;
          if (((undefined1  [16])pVar23 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            return false;
          }
        }
        AddInt64(this,number,'\x12',extension->is_packed,-(ulong)((uint)uVar16 & 1) ^ uVar16 >> 1,
                 extension->descriptor);
      }
    }
    io::CodedInputStream::PopLimit(input,limit);
    return true;
  }
  switch(extension->type) {
  case '\x01':
    pdVar5 = (double *)input->buffer_;
    if (*(int *)&input->buffer_end_ - (int)pdVar5 < 8) {
      bVar8 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64 *)&local_68);
      if (!bVar8) {
        return false;
      }
    }
    else {
      local_68._0_8_ = *pdVar5;
      input->buffer_ = (uint8 *)(pdVar5 + 1);
    }
    if (extension->is_repeated == true) {
      AddDouble(this,number,'\x01',extension->is_packed,(double)local_68._0_8_,extension->descriptor
               );
    }
    else {
      pFVar17 = extension->descriptor;
      local_70 = (FieldSkipper *)local_68._0_8_;
      pVar22 = Insert(this,number);
      pEVar12 = pVar22.first;
      pEVar12->descriptor = pFVar17;
      if (((undefined1  [16])pVar22 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pEVar12->type = '\x01';
        pEVar12->is_repeated = false;
      }
      pEVar12->field_0xa = pEVar12->field_0xa & 0xf0;
      (pEVar12->field_0).double_value = (double)local_70;
    }
    break;
  case '\x02':
    pfVar6 = (float *)input->buffer_;
    if (*(int *)&input->buffer_end_ - (int)pfVar6 < 4) {
      bVar8 = io::CodedInputStream::ReadLittleEndian32Fallback(input,&local_68.level_);
      if (!bVar8) {
        return false;
      }
    }
    else {
      local_68.level_ = (LogLevel_conflict)*pfVar6;
      input->buffer_ = (uint8 *)(pfVar6 + 1);
    }
    if (extension->is_repeated == true) {
      AddFloat(this,number,'\x02',extension->is_packed,(float)local_68.level_,extension->descriptor)
      ;
    }
    else {
      local_70 = (FieldSkipper *)CONCAT44(local_70._4_4_,local_68.level_);
      pFVar17 = extension->descriptor;
      pVar22 = Insert(this,number);
      pEVar12 = pVar22.first;
      pEVar12->descriptor = pFVar17;
      if (((undefined1  [16])pVar22 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pEVar12->type = '\x02';
        pEVar12->is_repeated = false;
      }
      pEVar12->field_0xa = pEVar12->field_0xa & 0xf0;
      (pEVar12->field_0).int32_value = (int32)local_70;
    }
    break;
  case '\x03':
    puVar3 = input->buffer_;
    if ((puVar3 < input->buffer_end_) && (dVar21 = (double)(long)(char)*puVar3, -1 < (long)dVar21))
    {
      input->buffer_ = puVar3 + 1;
    }
    else {
      pVar23 = io::CodedInputStream::ReadVarint64Fallback(input);
      dVar21 = (double)pVar23.first;
      if (((undefined1  [16])pVar23 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        return false;
      }
    }
    if (extension->is_repeated == true) {
      bVar8 = extension->is_packed;
      pFVar17 = extension->descriptor;
      FVar18 = '\x03';
LAB_002b8a27:
      AddInt64(this,number,FVar18,bVar8,(int64)dVar21,pFVar17);
      return true;
    }
    pFVar17 = extension->descriptor;
    pVar22 = Insert(this,number);
    pEVar12 = pVar22.first;
    pEVar12->descriptor = pFVar17;
    if (((undefined1  [16])pVar22 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pEVar12->type = '\x03';
      pEVar12->is_repeated = false;
    }
    goto LAB_002b8a51;
  case '\x04':
    puVar3 = input->buffer_;
    if ((puVar3 < input->buffer_end_) && (dVar21 = (double)(long)(char)*puVar3, -1 < (long)dVar21))
    {
      input->buffer_ = puVar3 + 1;
    }
    else {
      pVar23 = io::CodedInputStream::ReadVarint64Fallback(input);
      dVar21 = (double)pVar23.first;
      if (((undefined1  [16])pVar23 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        return false;
      }
    }
    if (extension->is_repeated == true) {
      bVar8 = extension->is_packed;
      pFVar17 = extension->descriptor;
      FVar18 = '\x04';
      goto LAB_002b894b;
    }
    pFVar17 = extension->descriptor;
    pVar22 = Insert(this,number);
    pEVar12 = pVar22.first;
    pEVar12->descriptor = pFVar17;
    if (((undefined1  [16])pVar22 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pEVar12->type = '\x04';
      pEVar12->is_repeated = false;
    }
    goto LAB_002b8a51;
  case '\x05':
    pbVar2 = input->buffer_;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar16 = (ulong)bVar1;
      uVar9 = (uint32)bVar1;
      if ((char)bVar1 < '\0') goto LAB_002b91b6;
      input->buffer_ = pbVar2 + 1;
    }
    else {
      uVar9 = 0;
LAB_002b91b6:
      uVar16 = io::CodedInputStream::ReadVarint32Fallback(input,uVar9);
      if ((long)uVar16 < 0) {
        return false;
      }
    }
    LVar20 = (LogLevel_conflict)uVar16;
    if (extension->is_repeated != true) {
      pFVar17 = extension->descriptor;
      pVar22 = Insert(this,number);
      pEVar12 = pVar22.first;
      pEVar12->descriptor = pFVar17;
      if (((undefined1  [16])pVar22 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pEVar12->type = '\x05';
        pEVar12->is_repeated = false;
      }
LAB_002b9271:
      pEVar12->field_0xa = pEVar12->field_0xa & 0xf0;
      (pEVar12->field_0).int32_value = LVar20;
      return true;
    }
    bVar8 = extension->is_packed;
    pFVar17 = extension->descriptor;
    FVar18 = '\x05';
    goto LAB_002b91ea;
  case '\x06':
    pdVar5 = (double *)input->buffer_;
    if (*(int *)&input->buffer_end_ - (int)pdVar5 < 8) {
      bVar8 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64 *)&local_68);
      if (!bVar8) {
        return false;
      }
    }
    else {
      local_68._0_8_ = *pdVar5;
      input->buffer_ = (uint8 *)(pdVar5 + 1);
    }
    uVar7 = local_68._0_8_;
    if (extension->is_repeated != true) {
      pFVar17 = extension->descriptor;
      pVar22 = Insert(this,number);
      pEVar12 = pVar22.first;
      pEVar12->descriptor = pFVar17;
      if (((undefined1  [16])pVar22 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pEVar12->type = '\x06';
        pEVar12->is_repeated = false;
      }
      pEVar12->field_0xa = pEVar12->field_0xa & 0xf0;
      (pEVar12->field_0).uint64_value = uVar7;
      return true;
    }
    bVar8 = extension->is_packed;
    pFVar17 = extension->descriptor;
    FVar18 = '\x06';
    dVar21 = (double)local_68._0_8_;
LAB_002b894b:
    AddUInt64(this,number,FVar18,bVar8,(uint64)dVar21,pFVar17);
    break;
  case '\a':
    puVar3 = input->buffer_;
    if (*(int *)&input->buffer_end_ - (int)puVar3 < 4) {
      bVar8 = io::CodedInputStream::ReadLittleEndian32Fallback(input,&local_68.level_);
      if (!bVar8) {
        return false;
      }
    }
    else {
      local_68.level_ = *(undefined4 *)puVar3;
      input->buffer_ = puVar3 + 4;
    }
    LVar20 = local_68.level_;
    if (extension->is_repeated != true) {
      pFVar17 = extension->descriptor;
      pVar22 = Insert(this,number);
      pEVar12 = pVar22.first;
      pEVar12->descriptor = pFVar17;
      if (((undefined1  [16])pVar22 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pEVar12->type = '\a';
        pEVar12->is_repeated = false;
      }
LAB_002b88b6:
      pEVar12->field_0xa = pEVar12->field_0xa & 0xf0;
      (pEVar12->field_0).int32_value = LVar20;
      return true;
    }
    bVar8 = extension->is_packed;
    pFVar17 = extension->descriptor;
    FVar18 = '\a';
    goto LAB_002b924a;
  case '\b':
    puVar3 = input->buffer_;
    if ((puVar3 < input->buffer_end_) && (uVar15 = (unsigned_long)(char)*puVar3, -1 < (long)uVar15))
    {
      input->buffer_ = puVar3 + 1;
    }
    else {
      pVar23 = io::CodedInputStream::ReadVarint64Fallback(input);
      uVar15 = pVar23.first;
      if (((undefined1  [16])pVar23 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        return false;
      }
    }
    if (extension->is_repeated == true) {
      AddBool(this,number,'\b',extension->is_packed,uVar15 != 0,extension->descriptor);
    }
    else {
      pFVar17 = extension->descriptor;
      pVar22 = Insert(this,number);
      pEVar12 = pVar22.first;
      pEVar12->descriptor = pFVar17;
      if (((undefined1  [16])pVar22 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pEVar12->type = '\b';
        pEVar12->is_repeated = false;
      }
      pEVar12->field_0xa = pEVar12->field_0xa & 0xf0;
      (pEVar12->field_0).bool_value = uVar15 != 0;
    }
    break;
  case '\t':
    pFVar17 = extension->descriptor;
    if (extension->is_repeated == true) {
      FVar18 = '\t';
      goto LAB_002b86e4;
    }
    FVar18 = '\t';
LAB_002b8792:
    value_00 = MutableString_abi_cxx11_(this,number,FVar18,pFVar17);
    goto LAB_002b8797;
  case '\n':
    pMVar11 = (MessageLite *)(extension->field_3).enum_validity_check.func;
    if (extension->is_repeated == true) {
      pMVar11 = AddMessage(this,number,'\n',pMVar11,extension->descriptor);
    }
    else {
      pMVar11 = MutableMessage(this,number,'\n',pMVar11,extension->descriptor);
    }
    iVar10 = input->recursion_budget_;
    input->recursion_budget_ = iVar10 + -1;
    if (iVar10 < 1) {
      return false;
    }
    bVar8 = MessageLite::MergePartialFromCodedStream(pMVar11,input);
    if (!bVar8) {
      return false;
    }
    input->recursion_budget_ = input->recursion_budget_ + 1;
    if (input->last_tag_ != number * 8 + 4U) {
      return false;
    }
    return true;
  case '\v':
    pMVar11 = (MessageLite *)(extension->field_3).enum_validity_check.func;
    if (extension->is_repeated == true) {
      pMVar11 = AddMessage(this,number,'\v',pMVar11,extension->descriptor);
    }
    else {
      pMVar11 = MutableMessage(this,number,'\v',pMVar11,extension->descriptor);
    }
    puVar3 = input->buffer_;
    if ((puVar3 < input->buffer_end_) && (iVar10 = (int)(char)*puVar3, -1 < (char)*puVar3)) {
      input->buffer_ = puVar3 + 1;
    }
    else {
      iVar10 = io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
      if (iVar10 < 0) {
        return false;
      }
    }
    pVar13 = io::CodedInputStream::IncrementRecursionDepthAndPushLimit(input,iVar10);
    if ((long)pVar13 < 0) {
      return false;
    }
    bVar8 = MessageLite::MergePartialFromCodedStream(pMVar11,input);
    if (!bVar8) {
      return false;
    }
    bVar8 = io::CodedInputStream::DecrementRecursionDepthAndPopLimit(input,pVar13.first);
    goto LAB_002b87a2;
  case '\f':
    pFVar17 = extension->descriptor;
    if (extension->is_repeated != true) {
      FVar18 = '\f';
      goto LAB_002b8792;
    }
    FVar18 = '\f';
LAB_002b86e4:
    value_00 = AddString_abi_cxx11_(this,number,FVar18,pFVar17);
LAB_002b8797:
    bVar8 = WireFormatLite::ReadBytes(input,value_00);
LAB_002b87a2:
    if (bVar8 == false) {
      return false;
    }
    break;
  case '\r':
    pbVar2 = input->buffer_;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar16 = (ulong)bVar1;
      uVar9 = (uint32)bVar1;
      if ((char)bVar1 < '\0') goto LAB_002b9216;
      input->buffer_ = pbVar2 + 1;
    }
    else {
      uVar9 = 0;
LAB_002b9216:
      uVar16 = io::CodedInputStream::ReadVarint32Fallback(input,uVar9);
      if ((long)uVar16 < 0) {
        return false;
      }
    }
    LVar20 = (LogLevel_conflict)uVar16;
    if (extension->is_repeated != true) {
      pFVar17 = extension->descriptor;
      pVar22 = Insert(this,number);
      pEVar12 = pVar22.first;
      pEVar12->descriptor = pFVar17;
      if (((undefined1  [16])pVar22 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pEVar12->type = '\r';
        pEVar12->is_repeated = false;
      }
      goto LAB_002b9271;
    }
    bVar8 = extension->is_packed;
    pFVar17 = extension->descriptor;
    FVar18 = '\r';
LAB_002b924a:
    AddUInt32(this,number,FVar18,bVar8,LVar20,pFVar17);
    break;
  case '\x0e':
    pbVar2 = input->buffer_;
    if (pbVar2 < input->buffer_end_) {
      uVar19 = (uint)*pbVar2;
      if ((char)*pbVar2 < '\0') goto LAB_002b92f8;
      input->buffer_ = pbVar2 + 1;
    }
    else {
      uVar19 = 0;
LAB_002b92f8:
      iVar14 = io::CodedInputStream::ReadVarint32Fallback(input,uVar19);
      uVar19 = (uint)iVar14;
      if (iVar14 < 0) {
        return false;
      }
    }
    bVar8 = (*(extension->field_3).enum_validity_check.func)
                      ((extension->field_3).enum_validity_check.arg,uVar19);
    if (bVar8) {
      if (extension->is_repeated == true) {
        AddEnum(this,number,'\x0e',extension->is_packed,uVar19,extension->descriptor);
      }
      else {
        pFVar17 = extension->descriptor;
        pVar22 = Insert(this,number);
        pEVar12 = pVar22.first;
        pEVar12->descriptor = pFVar17;
        if (((undefined1  [16])pVar22 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          pEVar12->type = '\x0e';
          pEVar12->is_repeated = false;
        }
        pEVar12->field_0xa = pEVar12->field_0xa & 0xf0;
        (pEVar12->field_0).enum_value = uVar19;
      }
    }
    else {
      (*field_skipper->_vptr_FieldSkipper[4])(field_skipper,number,(ulong)uVar19);
    }
    break;
  case '\x0f':
    pLVar4 = (LogLevel_conflict *)input->buffer_;
    if (*(int *)&input->buffer_end_ - (int)pLVar4 < 4) {
      bVar8 = io::CodedInputStream::ReadLittleEndian32Fallback(input,&local_68.level_);
      if (!bVar8) {
        return false;
      }
      LVar20 = local_68.level_;
    }
    else {
      LVar20 = *pLVar4;
      input->buffer_ = (uint8 *)(pLVar4 + 1);
    }
    if (extension->is_repeated != true) {
      pFVar17 = extension->descriptor;
      pVar22 = Insert(this,number);
      pEVar12 = pVar22.first;
      pEVar12->descriptor = pFVar17;
      if (((undefined1  [16])pVar22 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pEVar12->type = '\x0f';
        pEVar12->is_repeated = false;
      }
      goto LAB_002b88b6;
    }
    bVar8 = extension->is_packed;
    pFVar17 = extension->descriptor;
    FVar18 = '\x0f';
    goto LAB_002b91ea;
  case '\x10':
    pdVar5 = (double *)input->buffer_;
    if (*(int *)&input->buffer_end_ - (int)pdVar5 < 8) {
      bVar8 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64 *)&local_68);
      dVar21 = (double)local_68._0_8_;
      if (!bVar8) {
        return false;
      }
    }
    else {
      dVar21 = *pdVar5;
      input->buffer_ = (uint8 *)(pdVar5 + 1);
    }
    if (extension->is_repeated == true) {
      bVar8 = extension->is_packed;
      pFVar17 = extension->descriptor;
      FVar18 = '\x10';
      goto LAB_002b8a27;
    }
    pFVar17 = extension->descriptor;
    pVar22 = Insert(this,number);
    pEVar12 = pVar22.first;
    pEVar12->descriptor = pFVar17;
    if (((undefined1  [16])pVar22 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pEVar12->type = '\x10';
      pEVar12->is_repeated = false;
    }
    goto LAB_002b8a51;
  case '\x11':
    pbVar2 = input->buffer_;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar16 = (ulong)bVar1;
      uVar9 = (uint32)bVar1;
      if ((char)bVar1 < '\0') goto LAB_002b912d;
      input->buffer_ = pbVar2 + 1;
    }
    else {
      uVar9 = 0;
LAB_002b912d:
      uVar16 = io::CodedInputStream::ReadVarint32Fallback(input,uVar9);
      if ((long)uVar16 < 0) {
        return false;
      }
    }
    LVar20 = -((uint)uVar16 & 1) ^ (LogLevel_conflict)(uVar16 >> 1) & 0x7fffffff;
    if (extension->is_repeated != true) {
      pFVar17 = extension->descriptor;
      pVar22 = Insert(this,number);
      pEVar12 = pVar22.first;
      pEVar12->descriptor = pFVar17;
      if (((undefined1  [16])pVar22 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pEVar12->type = '\x11';
        pEVar12->is_repeated = false;
      }
      goto LAB_002b9271;
    }
    bVar8 = extension->is_packed;
    pFVar17 = extension->descriptor;
    FVar18 = '\x11';
LAB_002b91ea:
    AddInt32(this,number,FVar18,bVar8,LVar20,pFVar17);
    break;
  case '\x12':
    puVar3 = input->buffer_;
    if ((puVar3 < input->buffer_end_) && (uVar16 = (ulong)(char)*puVar3, -1 < (long)uVar16)) {
      input->buffer_ = puVar3 + 1;
    }
    else {
      pVar23 = io::CodedInputStream::ReadVarint64Fallback(input);
      uVar16 = pVar23.first;
      if (((undefined1  [16])pVar23 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        return false;
      }
    }
    dVar21 = (double)(-(ulong)((uint)uVar16 & 1) ^ uVar16 >> 1);
    if (extension->is_repeated == true) {
      bVar8 = extension->is_packed;
      pFVar17 = extension->descriptor;
      FVar18 = '\x12';
      goto LAB_002b8a27;
    }
    pFVar17 = extension->descriptor;
    pVar22 = Insert(this,number);
    pEVar12 = pVar22.first;
    pEVar12->descriptor = pFVar17;
    if (((undefined1  [16])pVar22 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pEVar12->type = '\x12';
      pEVar12->is_repeated = false;
    }
LAB_002b8a51:
    pEVar12->field_0xa = pEVar12->field_0xa & 0xf0;
    (pEVar12->field_0).int64_value = (int64)dVar21;
  }
  return true;
}

Assistant:

bool ExtensionSet::ParseFieldWithExtensionInfo(int number,
                                               bool was_packed_on_wire,
                                               const ExtensionInfo& extension,
                                               io::CodedInputStream* input,
                                               FieldSkipper* field_skipper) {
  // Explicitly not read extension.is_packed, instead check whether the field
  // was encoded in packed form on the wire.
  if (was_packed_on_wire) {
    uint32 size;
    if (!input->ReadVarint32(&size)) return false;
    io::CodedInputStream::Limit limit = input->PushLimit(size);

    switch (extension.type) {
#define HANDLE_TYPE(UPPERCASE, CPP_CAMELCASE, CPP_LOWERCASE)                \
  case WireFormatLite::TYPE_##UPPERCASE:                                    \
    while (input->BytesUntilLimit() > 0) {                                  \
      CPP_LOWERCASE value;                                                  \
      if (!WireFormatLite::ReadPrimitive<CPP_LOWERCASE,                     \
                                         WireFormatLite::TYPE_##UPPERCASE>( \
              input, &value))                                               \
        return false;                                                       \
      Add##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE,          \
                         extension.is_packed, value, extension.descriptor); \
    }                                                                       \
    break

      HANDLE_TYPE(INT32, Int32, int32);
      HANDLE_TYPE(INT64, Int64, int64);
      HANDLE_TYPE(UINT32, UInt32, uint32);
      HANDLE_TYPE(UINT64, UInt64, uint64);
      HANDLE_TYPE(SINT32, Int32, int32);
      HANDLE_TYPE(SINT64, Int64, int64);
      HANDLE_TYPE(FIXED32, UInt32, uint32);
      HANDLE_TYPE(FIXED64, UInt64, uint64);
      HANDLE_TYPE(SFIXED32, Int32, int32);
      HANDLE_TYPE(SFIXED64, Int64, int64);
      HANDLE_TYPE(FLOAT, Float, float);
      HANDLE_TYPE(DOUBLE, Double, double);
      HANDLE_TYPE(BOOL, Bool, bool);
#undef HANDLE_TYPE

      case WireFormatLite::TYPE_ENUM:
        while (input->BytesUntilLimit() > 0) {
          int value;
          if (!WireFormatLite::ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(
                  input, &value))
            return false;
          if (extension.enum_validity_check.func(
                  extension.enum_validity_check.arg, value)) {
            AddEnum(number, WireFormatLite::TYPE_ENUM, extension.is_packed,
                    value, extension.descriptor);
          } else {
            // Invalid value.  Treat as unknown.
            field_skipper->SkipUnknownEnum(number, value);
          }
        }
        break;

      case WireFormatLite::TYPE_STRING:
      case WireFormatLite::TYPE_BYTES:
      case WireFormatLite::TYPE_GROUP:
      case WireFormatLite::TYPE_MESSAGE:
        GOOGLE_LOG(FATAL) << "Non-primitive types can't be packed.";
        break;
    }

    input->PopLimit(limit);
  } else {
    switch (extension.type) {
#define HANDLE_TYPE(UPPERCASE, CPP_CAMELCASE, CPP_LOWERCASE)                \
  case WireFormatLite::TYPE_##UPPERCASE: {                                  \
    CPP_LOWERCASE value;                                                    \
    if (!WireFormatLite::ReadPrimitive<CPP_LOWERCASE,                       \
                                       WireFormatLite::TYPE_##UPPERCASE>(   \
            input, &value))                                                 \
      return false;                                                         \
    if (extension.is_repeated) {                                            \
      Add##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE,          \
                         extension.is_packed, value, extension.descriptor); \
    } else {                                                                \
      Set##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE, value,   \
                         extension.descriptor);                             \
    }                                                                       \
  } break

      HANDLE_TYPE(INT32, Int32, int32);
      HANDLE_TYPE(INT64, Int64, int64);
      HANDLE_TYPE(UINT32, UInt32, uint32);
      HANDLE_TYPE(UINT64, UInt64, uint64);
      HANDLE_TYPE(SINT32, Int32, int32);
      HANDLE_TYPE(SINT64, Int64, int64);
      HANDLE_TYPE(FIXED32, UInt32, uint32);
      HANDLE_TYPE(FIXED64, UInt64, uint64);
      HANDLE_TYPE(SFIXED32, Int32, int32);
      HANDLE_TYPE(SFIXED64, Int64, int64);
      HANDLE_TYPE(FLOAT, Float, float);
      HANDLE_TYPE(DOUBLE, Double, double);
      HANDLE_TYPE(BOOL, Bool, bool);
#undef HANDLE_TYPE

      case WireFormatLite::TYPE_ENUM: {
        int value;
        if (!WireFormatLite::ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(
                input, &value))
          return false;

        if (!extension.enum_validity_check.func(
                extension.enum_validity_check.arg, value)) {
          // Invalid value.  Treat as unknown.
          field_skipper->SkipUnknownEnum(number, value);
        } else if (extension.is_repeated) {
          AddEnum(number, WireFormatLite::TYPE_ENUM, extension.is_packed, value,
                  extension.descriptor);
        } else {
          SetEnum(number, WireFormatLite::TYPE_ENUM, value,
                  extension.descriptor);
        }
        break;
      }

      case WireFormatLite::TYPE_STRING: {
        std::string* value =
            extension.is_repeated
                ? AddString(number, WireFormatLite::TYPE_STRING,
                            extension.descriptor)
                : MutableString(number, WireFormatLite::TYPE_STRING,
                                extension.descriptor);
        if (!WireFormatLite::ReadString(input, value)) return false;
        break;
      }

      case WireFormatLite::TYPE_BYTES: {
        std::string* value =
            extension.is_repeated
                ? AddString(number, WireFormatLite::TYPE_BYTES,
                            extension.descriptor)
                : MutableString(number, WireFormatLite::TYPE_BYTES,
                                extension.descriptor);
        if (!WireFormatLite::ReadBytes(input, value)) return false;
        break;
      }

      case WireFormatLite::TYPE_GROUP: {
        MessageLite* value =
            extension.is_repeated
                ? AddMessage(number, WireFormatLite::TYPE_GROUP,
                             *extension.message_info.prototype,
                             extension.descriptor)
                : MutableMessage(number, WireFormatLite::TYPE_GROUP,
                                 *extension.message_info.prototype,
                                 extension.descriptor);
        if (!WireFormatLite::ReadGroup(number, input, value)) return false;
        break;
      }

      case WireFormatLite::TYPE_MESSAGE: {
        MessageLite* value =
            extension.is_repeated
                ? AddMessage(number, WireFormatLite::TYPE_MESSAGE,
                             *extension.message_info.prototype,
                             extension.descriptor)
                : MutableMessage(number, WireFormatLite::TYPE_MESSAGE,
                                 *extension.message_info.prototype,
                                 extension.descriptor);
        if (!WireFormatLite::ReadMessage(input, value)) return false;
        break;
      }
    }
  }

  return true;
}